

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timestamp.cpp
# Opt level: O2

string * __thiscall
mario::Timestamp::toFormattedString_abi_cxx11_(string *__return_storage_ptr__,Timestamp *this)

{
  long lVar1;
  allocator local_81;
  time_t seconds;
  char buf [32];
  tm tm_time;
  
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  lVar1 = this->_microSecondsSinceEpoch;
  seconds = lVar1 / 1000000;
  gmtime_r(&seconds,(tm *)&tm_time);
  snprintf(buf,0x20,"%4d%02d%02d %02d:%02d:%02d.%06d",(ulong)(tm_time.tm_year + 0x76c),
           (ulong)(tm_time.tm_mon + 1),(ulong)(uint)tm_time.tm_mday,(ulong)(uint)tm_time.tm_hour,
           (ulong)(uint)tm_time.tm_min,(ulong)(uint)tm_time.tm_sec,lVar1 % 1000000);
  std::__cxx11::string::string((string *)__return_storage_ptr__,buf,&local_81);
  return __return_storage_ptr__;
}

Assistant:

std::string Timestamp::toFormattedString() const {
  char buf[32] = {0};
  time_t seconds = static_cast<time_t>(_microSecondsSinceEpoch / kMicroSecondsPerSecond);
  int microseconds = static_cast<int>(_microSecondsSinceEpoch % kMicroSecondsPerSecond);
  struct tm tm_time;
  gmtime_r(&seconds, &tm_time);

  snprintf(buf, sizeof(buf), "%4d%02d%02d %02d:%02d:%02d.%06d",
      tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
      tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec,
      microseconds);
  return buf;
}